

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O2

int __thiscall dlib::rand::rand(rand *this)

{
  int iVar1;
  EVP_PKEY_CTX *in_RSI;
  long local_38;
  string local_30;
  
  this->_vptr_rand = (_func_int **)&PTR__rand_001fa5a0;
  random_helpers::
  mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
  ::seed(&this->mt);
  (this->seed)._M_dataplus._M_p = (pointer)&(this->seed).field_2;
  (this->seed)._M_string_length = 0;
  (this->seed).field_2._M_local_buf[0] = '\0';
  init(this,in_RSI);
  cast_to_string<long>(&local_30,&local_38);
  set_seed(this,&local_30);
  iVar1 = std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

rand (
                time_t seed_value
            )
            {
                init();
                set_seed(cast_to_string(seed_value));
            }